

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::Texture2DSpecCase::verifyTexture
          (Texture2DSpecCase *this,GLContext *gles3Context,ReferenceContext *refContext)

{
  TestLog *log;
  deUint32 program;
  Surface *dst;
  _Alloc_hider imageSetDesc;
  _Alloc_hider imageSetName;
  bool bVar1;
  DataType type;
  DataTypes *samplerTypes;
  RenderTarget *pRVar2;
  int iVar3;
  ReferenceContext *pRVar4;
  int iVar5;
  int height;
  int local_2e4;
  ReferenceContext *local_2e0;
  ReferenceContext *local_2d8;
  deUint32 local_2d0;
  deUint32 local_2cc;
  Texture2DSpecCase *local_2c8;
  ContextWrapper *local_2c0;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  Surface result;
  Surface reference;
  string levelStr;
  string desc;
  string name;
  UVec4 threshold;
  ConstPixelBufferAccess local_1f0;
  Texture2DShader shader;
  
  local_2b8._0_4_ = R;
  local_2b8._4_4_ = SNORM_INT8;
  local_2b8._8_8_ = (pointer)0x0;
  local_2a8._M_allocated_capacity = 0;
  local_2e0 = (ReferenceContext *)gles3Context;
  local_2d8 = refContext;
  type = glu::getSampler2DType(this->m_texFormat);
  samplerTypes = FboTestUtil::DataTypes::operator<<((DataTypes *)local_2b8,type);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1f0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&levelStr,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&shader,samplerTypes,TYPE_FLOAT_VEC4,(Vec4 *)&local_1f0,(Vec4 *)&levelStr);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)local_2b8);
  local_2cc = (*(local_2e0->super_Context)._vptr_Context[0x75])(local_2e0,&shader);
  local_2d0 = (*(local_2d8->super_Context)._vptr_Context[0x75])();
  FboTestUtil::Texture2DShader::setTexScaleBias
            (&shader,0,&(this->m_texFormatInfo).lookupScale,&(this->m_texFormatInfo).lookupBias);
  local_2c0 = &(this->super_TextureSpecCase).super_ContextWrapper;
  iVar3 = 2;
  while (iVar3 != 0) {
    pRVar4 = local_2d8;
    if (iVar3 == 2) {
      pRVar4 = local_2e0;
    }
    sglr::ContextWrapper::setContext(local_2c0,&pRVar4->super_Context);
    sglr::ContextWrapper::glTexParameteri(local_2c0,0xde1,0x2801,0x2700);
    sglr::ContextWrapper::glTexParameteri(local_2c0,0xde1,0x2800,0x2600);
    sglr::ContextWrapper::glTexParameteri(local_2c0,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_2c0,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_2c0,0xde1,0x813d,this->m_numLevels + -1);
    iVar3 = iVar3 + -1;
  }
  local_2c8 = this;
  for (local_2e4 = 0; local_2e4 < this->m_numLevels; local_2e4 = local_2e4 + 1) {
    iVar3 = this->m_width >> ((byte)local_2e4 & 0x1f);
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    height = this->m_height >> ((byte)local_2e4 & 0x1f);
    if (height < 2) {
      height = 1;
    }
    tcu::Surface::Surface(&reference);
    tcu::Surface::Surface(&result);
    iVar5 = 2;
    while (this = local_2c8, iVar5 != 0) {
      program = local_2d0;
      dst = &reference;
      pRVar4 = local_2d8;
      if (iVar5 == 2) {
        program = local_2cc;
        dst = &result;
        pRVar4 = local_2e0;
      }
      sglr::ContextWrapper::setContext(local_2c0,&pRVar4->super_Context);
      FboTestUtil::Texture2DShader::setUniforms(&shader,&pRVar4->super_Context,program);
      TextureSpecCase::renderTex(&local_2c8->super_TextureSpecCase,dst,program,iVar3,height);
      iVar5 = iVar5 + -1;
    }
    pRVar2 = Context::getRenderTarget((local_2c8->super_TextureSpecCase).super_TestCase.m_context);
    computeCompareThreshold((Functional *)&threshold,&pRVar2->m_pixelFormat,this->m_texFormat);
    de::toString<int>(&levelStr,&local_2e4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2b8,"Level",(allocator<char> *)&local_1f0);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b8,&levelStr);
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2b8,"Level ",(allocator<char> *)&local_1f0);
    std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b8,&levelStr);
    std::__cxx11::string::~string((string *)local_2b8);
    imageSetName = name._M_dataplus;
    imageSetDesc = desc._M_dataplus;
    log = ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
          m_log;
    tcu::Surface::getAccess((PixelBufferAccess *)local_2b8,&reference);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_1f0,&result);
    bVar1 = tcu::intThresholdCompare
                      (log,imageSetName._M_p,imageSetDesc._M_p,(ConstPixelBufferAccess *)local_2b8,
                       &local_1f0,&threshold,COMPARE_LOG_ON_ERROR - (local_2e4 == 0));
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
    }
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&levelStr);
    tcu::Surface::~Surface(&result);
    tcu::Surface::~Surface(&reference);
    if (!bVar1) break;
  }
  FboTestUtil::Texture2DShader::~Texture2DShader(&shader);
  return;
}

Assistant:

void Texture2DSpecCase::verifyTexture (sglr::GLContext& gles3Context, sglr::ReferenceContext& refContext)
{
	Texture2DShader shader			(DataTypes() << glu::getSampler2DType(m_texFormat), glu::TYPE_FLOAT_VEC4);
	deUint32		shaderIDgles	= gles3Context.createProgram(&shader);
	deUint32		shaderIDRef		= refContext.createProgram(&shader);

	shader.setTexScaleBias(0, m_texFormatInfo.lookupScale, m_texFormatInfo.lookupBias);

	// Set state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		sglr::Context* ctx = ndx ? static_cast<sglr::Context*>(&refContext) : static_cast<sglr::Context*>(&gles3Context);

		setContext(ctx);

		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL,	m_numLevels-1);
	}

	for (int levelNdx = 0; levelNdx < m_numLevels; levelNdx++)
	{
		int				levelW		= de::max(1, m_width >> levelNdx);
		int				levelH		= de::max(1, m_height >> levelNdx);
		tcu::Surface	reference;
		tcu::Surface	result;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			tcu::Surface&	dst			= ndx ? reference									: result;
			sglr::Context*	ctx			= ndx ? static_cast<sglr::Context*>(&refContext)	: static_cast<sglr::Context*>(&gles3Context);
			deUint32		shaderID	= ndx ? shaderIDRef									: shaderIDgles;

			setContext(ctx);
			shader.setUniforms(*ctx, shaderID);
			renderTex(dst, shaderID, levelW, levelH);
		}

		UVec4			threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
		string			levelStr	= de::toString(levelNdx);
		string			name		= string("Level") + levelStr;
		string			desc		= string("Level ") + levelStr;
		bool			isOk		= tcu::intThresholdCompare(m_testCtx.getLog(), name.c_str(), desc.c_str(), reference.getAccess(), result.getAccess(), threshold,
															   levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

		if (!isOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			break;
		}
	}
}